

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionCallNode *node)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  long *plVar3;
  PrintVisitor visitor;
  string local_40;
  
  poVar2 = this->stream_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,"FunctionCallNode:\n");
  std::__cxx11::string::~string((string *)&local_40);
  poVar2 = this->stream_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"Name: ");
  poVar2 = std::operator<<(poVar2,(string *)&node->name_);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  poVar2 = this->stream_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,"Arguments:\n");
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_string_length = (size_type)this->stream_;
  local_40.field_2._M_allocated_capacity._0_4_ = this->indentation_ + 1;
  local_40._M_dataplus._M_p = (pointer)&PTR__Visitor_00148d30;
  iVar1 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)CONCAT44(extraout_var,iVar1)) {
    (**(code **)(*(long *)plVar3[2] + 0x10))((long *)plVar3[2],&local_40);
  }
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionCallNode& node)
{
  stream_ << indent() << "FunctionCallNode:\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Arguments:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
}